

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O2

void __thiscall absl::base_internal::SpinLock::SlowLock(SpinLock *this)

{
  uint uVar1;
  __int_type_conflict1 _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  int64_t wait_start_time;
  int64_t wait_end_time;
  SchedulingMode SVar5;
  uint value;
  int iVar6;
  bool bVar7;
  
  uVar3 = SpinLoop(this);
  if ((uVar3 & 1) == 0) {
    LOCK();
    uVar4 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if (uVar3 == uVar4) {
      (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar3 | 1;
      uVar4 = uVar3;
    }
    uVar3 = uVar4;
    UNLOCK();
    if ((uVar3 & 1) == 0) {
      return;
    }
  }
  SVar5 = uVar3 >> 1;
  uVar4 = 0;
  wait_start_time = CycleClock::Now();
  iVar6 = 0;
LAB_00111877:
  if ((uVar3 & 1) == 0) {
    return;
  }
  value = uVar3;
  if (7 < uVar3) goto LAB_001118be;
  value = uVar3 | 8;
  LOCK();
  uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
  bVar7 = uVar3 == uVar1;
  if (bVar7) {
    (this->lockword_).super___atomic_base<unsigned_int>._M_i = value;
    uVar1 = uVar3;
  }
  uVar3 = uVar1;
  UNLOCK();
  if (bVar7) goto LAB_001118be;
  if ((uVar3 & 1) != 0) goto LAB_001118b0;
  goto LAB_0011189b;
LAB_001118b0:
  value = uVar3;
  if (7 < uVar3) {
LAB_001118be:
    iVar6 = iVar6 + 1;
    AbslInternalSpinLockDelay(&this->lockword_,value,iVar6,SVar5 & SCHEDULE_COOPERATIVE_AND_KERNEL);
    uVar3 = SpinLoop(this);
    wait_end_time = CycleClock::Now();
    uVar4 = EncodeWaitCycles(wait_start_time,wait_end_time);
    if ((uVar3 & 1) == 0) {
LAB_0011189b:
      LOCK();
      _Var2 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
      if (uVar3 == _Var2) {
        (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar3 | uVar4 | 1;
        _Var2 = uVar3;
      }
      uVar3 = _Var2;
      UNLOCK();
    }
  }
  goto LAB_00111877;
}

Assistant:

void SpinLock::SlowLock() {
  uint32_t lock_value = SpinLoop();
  lock_value = TryLockInternal(lock_value, 0);
  if ((lock_value & kSpinLockHeld) == 0) {
    return;
  }

  base_internal::SchedulingMode scheduling_mode;
  if ((lock_value & kSpinLockCooperative) != 0) {
    scheduling_mode = base_internal::SCHEDULE_COOPERATIVE_AND_KERNEL;
  } else {
    scheduling_mode = base_internal::SCHEDULE_KERNEL_ONLY;
  }

  // The lock was not obtained initially, so this thread needs to wait for
  // it.  Record the current timestamp in the local variable wait_start_time
  // so the total wait time can be stored in the lockword once this thread
  // obtains the lock.
  int64_t wait_start_time = CycleClock::Now();
  uint32_t wait_cycles = 0;
  int lock_wait_call_count = 0;
  while ((lock_value & kSpinLockHeld) != 0) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if ((lock_value & kWaitTimeMask) == 0) {
      // Here, just "mark" that the thread is going to sleep.  Don't store the
      // lock wait time in the lock -- the lock word stores the amount of time
      // that the current holder waited before acquiring the lock, not the wait
      // time of any thread currently waiting to acquire it.
      if (lockword_.compare_exchange_strong(
              lock_value, lock_value | kSpinLockSleeper,
              std::memory_order_relaxed, std::memory_order_relaxed)) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockWait routine to properly indicate
        // the last lock_value observed.
        lock_value |= kSpinLockSleeper;
      } else if ((lock_value & kSpinLockHeld) == 0) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lock_value = TryLockInternal(lock_value, wait_cycles);
        continue;   // Skip the delay at the end of the loop.
      } else if ((lock_value & kWaitTimeMask) == 0) {
        // The lock is still held, without a waiter being marked, but something
        // else about the lock word changed, causing our CAS to fail. For
        // example, a new lock holder may have acquired the lock with
        // kSpinLockDisabledScheduling set, whereas the previous holder had not
        // set that flag. In this case, attempt again to mark ourselves as a
        // waiter.
        continue;
      }
    }

    // SpinLockDelay() calls into fiber scheduler, we need to see
    // synchronization there to avoid false positives.
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    // Wait for an OS specific delay.
    base_internal::SpinLockDelay(&lockword_, lock_value, ++lock_wait_call_count,
                                 scheduling_mode);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
    wait_cycles = EncodeWaitCycles(wait_start_time, CycleClock::Now());
    lock_value = TryLockInternal(lock_value, wait_cycles);
  }
}